

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeCommandListCreatePrologue
          (ZEHandleLifetimeValidation *this,ze_context_handle_t hContext,ze_device_handle_t hDevice,
          ze_command_list_desc_t *desc,ze_command_list_handle_t *phCommandList)

{
  long lVar1;
  bool bVar2;
  ze_result_t zVar3;
  
  lVar1 = context;
  bVar2 = HandleLifetimeValidation::isHandleValid
                    (*(HandleLifetimeValidation **)(context + 0xd48),hContext);
  zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (bVar2) {
    bVar2 = HandleLifetimeValidation::isHandleValid
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hDevice);
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    if (bVar2) {
      zVar3 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar3;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeCommandListCreatePrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        const ze_command_list_desc_t* desc,             ///< [in] pointer to command list descriptor
        ze_command_list_handle_t* phCommandList         ///< [out] pointer to handle of command list object created
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hContext )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if ( !context.handleLifetime->isHandleValid( hDevice )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }